

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::DockNodeTreeUpdatePosSize
               (ImGuiDockNode *node,ImVec2 pos,ImVec2 size,bool only_write_to_marked_nodes)

{
  ushort uVar1;
  ImGuiDockNode *node_00;
  ImGuiDockNode *node_01;
  ImVec2 pos_00;
  undefined1 auVar2 [16];
  float *pfVar3;
  undefined7 in_register_00000031;
  ImVec2 *this;
  ImVec2 *this_00;
  size_t idx;
  uint uVar4;
  float fVar5;
  float fVar6;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  float fVar7;
  ImVec2 child_0_size;
  ImVec2 child_1_size;
  ImVec2 child_1_pos;
  ImVec2 local_88;
  ImVec2 local_80;
  float local_74;
  ImVec2 local_70;
  undefined1 local_68 [16];
  ImVec2 local_50;
  undefined1 local_48 [24];
  
  if (((int)CONCAT71(in_register_00000031,only_write_to_marked_nodes) == 0) ||
     ((node->field_0xba & 8) != 0)) {
    auVar2._8_4_ = size.x;
    auVar2._0_8_ = pos;
    auVar2._12_4_ = size.y;
    node->Pos = pos;
    (node->Size).x = (float)(int)auVar2._8_8_;
    (node->Size).y = (float)(int)((ulong)auVar2._8_8_ >> 0x20);
  }
  node_00 = node->ChildNodes[0];
  if (node_00 == (ImGuiDockNode *)0x0) {
    return;
  }
  node_01 = node->ChildNodes[1];
  fVar7 = pos.x;
  fVar6 = pos.y;
  local_88 = size;
  local_80 = size;
  local_70 = pos;
  local_50 = size;
  if (((node_00->field_0xb9 & 2) == 0) || ((node_01->field_0xb9 & 2) == 0)) goto LAB_00139aef;
  local_48._8_4_ = in_XMM0_Dc;
  local_48._0_8_ = pos;
  local_48._12_4_ = in_XMM0_Dd;
  idx = (size_t)node->SplitAxis;
  pfVar3 = ImVec2::operator[](&local_50,idx);
  fVar7 = (float)(-(uint)(0.0 <= *pfVar3 + -2.0) & (uint)(*pfVar3 + -2.0));
  pfVar3 = ImVec2::operator[](&(GImGui->Style).WindowMinSize,idx);
  if (*(short *)&node_00->field_0xb8 < 0) {
    if (*(short *)&node_01->field_0xb8 < 0) {
      pfVar3 = ImVec2::operator[](&local_88,idx);
      fVar6 = *pfVar3;
      pfVar3 = ImVec2::operator[](&local_88,idx);
      local_68._0_4_ = *pfVar3;
      pfVar3 = ImVec2::operator[](&local_80,idx);
      fVar6 = (float)(int)((fVar6 / ((float)local_68._0_4_ + *pfVar3)) * fVar7);
      pfVar3 = ImVec2::operator[](&node_00->SizeRef,idx);
      *pfVar3 = fVar6;
      pfVar3 = ImVec2::operator[](&local_88,idx);
      *pfVar3 = fVar6;
      pfVar3 = ImVec2::operator[](&local_88,idx);
      fVar6 = *pfVar3;
      pfVar3 = ImVec2::operator[](&node_01->SizeRef,idx);
      *pfVar3 = fVar7 - fVar6;
      pfVar3 = ImVec2::operator[](&local_80,idx);
      *pfVar3 = fVar7 - fVar6;
      pfVar3 = ImVec2::operator[](&node_00->SizeRef,idx);
      if ((*pfVar3 <= 0.0) || (pfVar3 = ImVec2::operator[](&node_01->SizeRef,idx), *pfVar3 <= 0.0))
      {
        __assert_fail("child_0->SizeRef[axis] > 0.0f && child_1->SizeRef[axis] > 0.0f",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                      ,0x36d2,
                      "void ImGui::DockNodeTreeUpdatePosSize(ImGuiDockNode *, ImVec2, ImVec2, bool)"
                     );
      }
    }
    else {
      pfVar3 = ImVec2::operator[](&node_00->Size,idx);
      fVar6 = fVar7 + -1.0;
      if (*pfVar3 <= fVar7 + -1.0) {
        fVar6 = *pfVar3;
      }
      pfVar3 = ImVec2::operator[](&node_00->SizeRef,idx);
      *pfVar3 = fVar6;
      pfVar3 = ImVec2::operator[](&local_88,idx);
      *pfVar3 = fVar6;
      pfVar3 = ImVec2::operator[](&local_88,idx);
      fVar6 = *pfVar3;
      pfVar3 = ImVec2::operator[](&node_01->SizeRef,idx);
      *pfVar3 = fVar7 - fVar6;
      pfVar3 = ImVec2::operator[](&local_80,idx);
      *pfVar3 = fVar7 - fVar6;
      pfVar3 = ImVec2::operator[](&node_00->SizeRef,idx);
      if ((*pfVar3 <= 0.0) || (pfVar3 = ImVec2::operator[](&node_01->SizeRef,idx), *pfVar3 <= 0.0))
      {
        __assert_fail("child_0->SizeRef[axis] > 0.0f && child_1->SizeRef[axis] > 0.0f",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                      ,0x36c3,
                      "void ImGui::DockNodeTreeUpdatePosSize(ImGuiDockNode *, ImVec2, ImVec2, bool)"
                     );
      }
    }
  }
  else if (*(short *)&node_01->field_0xb8 < 0) {
    pfVar3 = ImVec2::operator[](&node_01->Size,idx);
    fVar6 = fVar7 + -1.0;
    if (*pfVar3 <= fVar7 + -1.0) {
      fVar6 = *pfVar3;
    }
    pfVar3 = ImVec2::operator[](&node_01->SizeRef,idx);
    *pfVar3 = fVar6;
    pfVar3 = ImVec2::operator[](&local_80,idx);
    *pfVar3 = fVar6;
    pfVar3 = ImVec2::operator[](&local_80,idx);
    fVar6 = *pfVar3;
    pfVar3 = ImVec2::operator[](&node_00->SizeRef,idx);
    *pfVar3 = fVar7 - fVar6;
    pfVar3 = ImVec2::operator[](&local_88,idx);
    *pfVar3 = fVar7 - fVar6;
    pfVar3 = ImVec2::operator[](&node_00->SizeRef,idx);
    if ((*pfVar3 <= 0.0) || (pfVar3 = ImVec2::operator[](&node_01->SizeRef,idx), *pfVar3 <= 0.0)) {
      __assert_fail("child_0->SizeRef[axis] > 0.0f && child_1->SizeRef[axis] > 0.0f",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                    ,0x36c9,
                    "void ImGui::DockNodeTreeUpdatePosSize(ImGuiDockNode *, ImVec2, ImVec2, bool)");
    }
  }
  else {
    fVar5 = *pfVar3 + *pfVar3;
    fVar6 = fVar7;
    if (fVar5 <= fVar7) {
      fVar6 = fVar5;
    }
    fVar6 = (float)(int)(fVar6 * 0.5);
    if ((node_01->LocalFlags & 0x800) == 0) {
LAB_0013977b:
      if ((node_00->LocalFlags & 0x800) == 0) {
LAB_001398d6:
        pfVar3 = ImVec2::operator[](&node_00->SizeRef,idx);
        local_68 = ZEXT416((uint)*pfVar3);
        pfVar3 = ImVec2::operator[](&node_00->SizeRef,idx);
        local_74 = *pfVar3;
        pfVar3 = ImVec2::operator[](&node_01->SizeRef,idx);
        fVar5 = (float)(int)(((float)local_68._0_4_ / (local_74 + *pfVar3)) * fVar7 + 0.5);
        uVar4 = -(uint)(fVar5 <= fVar6);
        fVar5 = (float)(uVar4 & (uint)fVar6 | ~uVar4 & (uint)fVar5);
        goto LAB_00139953;
      }
      pfVar3 = ImVec2::operator[](&node_01->SizeRef,idx);
      if ((*pfVar3 == 0.0) && (!NAN(*pfVar3))) goto LAB_001398d6;
      pfVar3 = ImVec2::operator[](&node_01->SizeRef,idx);
      fVar5 = fVar7 - fVar6;
      if (*pfVar3 <= fVar7 - fVar6) {
        fVar5 = *pfVar3;
      }
      this = &local_88;
      this_00 = &local_80;
    }
    else {
      pfVar3 = ImVec2::operator[](&node_00->SizeRef,idx);
      if ((*pfVar3 == 0.0) && (!NAN(*pfVar3))) goto LAB_0013977b;
      pfVar3 = ImVec2::operator[](&node_00->SizeRef,idx);
      fVar5 = fVar7 - fVar6;
      if (*pfVar3 <= fVar7 - fVar6) {
        fVar5 = *pfVar3;
      }
LAB_00139953:
      this = &local_80;
      this_00 = &local_88;
    }
    pfVar3 = ImVec2::operator[](this_00,idx);
    *pfVar3 = fVar5;
    pfVar3 = ImVec2::operator[](this_00,idx);
    fVar6 = *pfVar3;
    pfVar3 = ImVec2::operator[](this,idx);
    *pfVar3 = fVar7 - fVar6;
  }
  pfVar3 = ImVec2::operator[](&local_88,idx);
  fVar7 = *pfVar3;
  pfVar3 = ImVec2::operator[](&local_70,idx);
  *pfVar3 = fVar7 + 2.0 + *pfVar3;
  fVar7 = (float)local_48._0_4_;
  fVar6 = (float)local_48._4_4_;
LAB_00139aef:
  node_01->field_0xb9 = node_01->field_0xb9 & 0x7f;
  uVar1 = *(ushort *)&node_00->field_0xb8;
  *(ushort *)&node_00->field_0xb8 = uVar1 & 0x7fff;
  if ((uVar1 >> 9 & 1) != 0) {
    pos_00.y = fVar6;
    pos_00.x = fVar7;
    DockNodeTreeUpdatePosSize(node_00,pos_00,local_88,false);
  }
  if ((node_01->field_0xb9 & 2) != 0) {
    DockNodeTreeUpdatePosSize(node_01,local_70,local_80,false);
  }
  return;
}

Assistant:

void ImGui::DockNodeTreeUpdatePosSize(ImGuiDockNode* node, ImVec2 pos, ImVec2 size, bool only_write_to_marked_nodes)
{
    // During the regular dock node update we write to all nodes.
    // 'only_write_to_marked_nodes' is only set when turning a node visible mid-frame and we need its size right-away.
    const bool write_to_node = (only_write_to_marked_nodes == false) || (node->MarkedForPosSizeWrite);
    if (write_to_node)
    {
        node->Pos = pos;
        node->Size = size;
    }

    if (node->IsLeafNode())
        return;

    ImGuiDockNode* child_0 = node->ChildNodes[0];
    ImGuiDockNode* child_1 = node->ChildNodes[1];
    ImVec2 child_0_pos = pos, child_1_pos = pos;
    ImVec2 child_0_size = size, child_1_size = size;
    if (child_0->IsVisible && child_1->IsVisible)
    {
        const float spacing = DOCKING_SPLITTER_SIZE;
        const ImGuiAxis axis = (ImGuiAxis)node->SplitAxis;
        const float size_avail = ImMax(size[axis] - spacing, 0.0f);

        // Size allocation policy
        // 1) The first 0..WindowMinSize[axis]*2 are allocated evenly to both windows.
        ImGuiContext& g = *GImGui;
        const float size_min_each = ImFloor(ImMin(size_avail, g.Style.WindowMinSize[axis] * 2.0f) * 0.5f);

        // 2) Process locked absolute size (during a splitter resize we preserve the child of nodes not touching the splitter edge)
        if (child_0->WantLockSizeOnce && !child_1->WantLockSizeOnce)
        {
            child_0_size[axis] = child_0->SizeRef[axis] = ImMin(size_avail - 1.0f, child_0->Size[axis]);
            child_1_size[axis] = child_1->SizeRef[axis] = (size_avail - child_0_size[axis]);
            IM_ASSERT(child_0->SizeRef[axis] > 0.0f && child_1->SizeRef[axis] > 0.0f);
        }
        else if (child_1->WantLockSizeOnce && !child_0->WantLockSizeOnce)
        {
            child_1_size[axis] = child_1->SizeRef[axis] = ImMin(size_avail - 1.0f, child_1->Size[axis]);
            child_0_size[axis] = child_0->SizeRef[axis] = (size_avail - child_1_size[axis]);
            IM_ASSERT(child_0->SizeRef[axis] > 0.0f && child_1->SizeRef[axis] > 0.0f);
        }
        else if (child_0->WantLockSizeOnce && child_1->WantLockSizeOnce)
        {
            // FIXME-DOCK: We cannot honor the requested size, so apply ratio.
            // Currently this path will only be taken if code programmatically sets WantLockSizeOnce
            float ratio_0 = child_0_size[axis] / (child_0_size[axis] + child_1_size[axis]);
            child_0_size[axis] = child_0->SizeRef[axis] = ImFloor(size_avail * ratio_0);
            child_1_size[axis] = child_1->SizeRef[axis] = (size_avail - child_0_size[axis]);
            IM_ASSERT(child_0->SizeRef[axis] > 0.0f && child_1->SizeRef[axis] > 0.0f);
        }

        // 3) If one window is the central node (~ use remaining space, should be made explicit!), use explicit size from the other, and remainder for the central node
        else if (child_1->IsCentralNode() && child_0->SizeRef[axis] != 0.0f)
        {
            child_0_size[axis] = ImMin(size_avail - size_min_each, child_0->SizeRef[axis]);
            child_1_size[axis] = (size_avail - child_0_size[axis]);
        }
        else if (child_0->IsCentralNode() && child_1->SizeRef[axis] != 0.0f)
        {
            child_1_size[axis] = ImMin(size_avail - size_min_each, child_1->SizeRef[axis]);
            child_0_size[axis] = (size_avail - child_1_size[axis]);
        }
        else
        {
            // 4) Otherwise distribute according to the relative ratio of each SizeRef value
            float split_ratio = child_0->SizeRef[axis] / (child_0->SizeRef[axis] + child_1->SizeRef[axis]);
            child_0_size[axis] = ImMax(size_min_each, ImFloor(size_avail * split_ratio + 0.5F));
            child_1_size[axis] = (size_avail - child_0_size[axis]);
        }

        child_1_pos[axis] += spacing + child_0_size[axis];
    }
    child_0->WantLockSizeOnce = child_1->WantLockSizeOnce = false;

    if (child_0->IsVisible)
        DockNodeTreeUpdatePosSize(child_0, child_0_pos, child_0_size);
    if (child_1->IsVisible)
        DockNodeTreeUpdatePosSize(child_1, child_1_pos, child_1_size);
}